

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_add_itext(LodePNGInfo *info,char *key,char *langtag,char *transkey,char *str)

{
  size_t sVar1;
  uint uVar2;
  char **ppcVar3;
  char **__ptr;
  char **__ptr_00;
  char **__ptr_01;
  char *pcVar4;
  
  ppcVar3 = (char **)realloc(info->itext_keys,info->itext_num * 8 + 8);
  __ptr = (char **)realloc(info->itext_langtags,info->itext_num * 8 + 8);
  __ptr_00 = (char **)realloc(info->itext_transkeys,info->itext_num * 8 + 8);
  __ptr_01 = (char **)realloc(info->itext_strings,info->itext_num * 8 + 8);
  if ((((ppcVar3 == (char **)0x0) || (__ptr == (char **)0x0)) || (__ptr_00 == (char **)0x0)) ||
     (__ptr_01 == (char **)0x0)) {
    free(ppcVar3);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    uVar2 = 0x53;
  }
  else {
    sVar1 = info->itext_num;
    info->itext_num = sVar1 + 1;
    info->itext_keys = ppcVar3;
    info->itext_langtags = __ptr;
    info->itext_transkeys = __ptr_00;
    info->itext_strings = __ptr_01;
    ppcVar3[sVar1] = (char *)0x0;
    pcVar4 = (char *)malloc(1);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      ppcVar3[sVar1] = pcVar4;
    }
    string_set(ppcVar3 + sVar1,key);
    sVar1 = info->itext_num;
    ppcVar3 = info->itext_langtags;
    ppcVar3[sVar1 - 1] = (char *)0x0;
    pcVar4 = (char *)malloc(1);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      ppcVar3[sVar1 - 1] = pcVar4;
    }
    string_set(info->itext_langtags + (sVar1 - 1),langtag);
    sVar1 = info->itext_num;
    ppcVar3 = info->itext_transkeys;
    ppcVar3[sVar1 - 1] = (char *)0x0;
    pcVar4 = (char *)malloc(1);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      ppcVar3[sVar1 - 1] = pcVar4;
    }
    string_set(info->itext_transkeys + (sVar1 - 1),transkey);
    sVar1 = info->itext_num;
    ppcVar3 = info->itext_strings;
    ppcVar3[sVar1 - 1] = (char *)0x0;
    pcVar4 = (char *)malloc(1);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      ppcVar3[sVar1 - 1] = pcVar4;
    }
    string_set(info->itext_strings + (sVar1 - 1),str);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

unsigned lodepng_add_itext(LodePNGInfo* info, const char* key, const char* langtag,
                           const char* transkey, const char* str)
{
  char** new_keys = (char**)(lodepng_realloc(info->itext_keys, sizeof(char*) * (info->itext_num + 1)));
  char** new_langtags = (char**)(lodepng_realloc(info->itext_langtags, sizeof(char*) * (info->itext_num + 1)));
  char** new_transkeys = (char**)(lodepng_realloc(info->itext_transkeys, sizeof(char*) * (info->itext_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->itext_strings, sizeof(char*) * (info->itext_num + 1)));
  if(!new_keys || !new_langtags || !new_transkeys || !new_strings)
  {
    lodepng_free(new_keys);
    lodepng_free(new_langtags);
    lodepng_free(new_transkeys);
    lodepng_free(new_strings);
    return 83; /*alloc fail*/
  }

  ++info->itext_num;
  info->itext_keys = new_keys;
  info->itext_langtags = new_langtags;
  info->itext_transkeys = new_transkeys;
  info->itext_strings = new_strings;

  string_init(&info->itext_keys[info->itext_num - 1]);
  string_set(&info->itext_keys[info->itext_num - 1], key);

  string_init(&info->itext_langtags[info->itext_num - 1]);
  string_set(&info->itext_langtags[info->itext_num - 1], langtag);

  string_init(&info->itext_transkeys[info->itext_num - 1]);
  string_set(&info->itext_transkeys[info->itext_num - 1], transkey);

  string_init(&info->itext_strings[info->itext_num - 1]);
  string_set(&info->itext_strings[info->itext_num - 1], str);

  return 0;
}